

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwobjects.h
# Opt level: O2

void __thiscall rw::ObjectWithFrame::setFrame(ObjectWithFrame *this,Frame *f)

{
  LLLink *pLVar1;
  LLLink *pLVar2;
  
  if ((this->object).parent != (void *)0x0) {
    pLVar1 = (this->inFrame).next;
    pLVar2 = (this->inFrame).prev;
    pLVar2->next = pLVar1;
    pLVar1->prev = pLVar2;
  }
  (this->object).parent = f;
  if (f != (Frame *)0x0) {
    pLVar1 = (f->objectList).link.next;
    (this->inFrame).next = pLVar1;
    (this->inFrame).prev = &(f->objectList).link;
    pLVar1->prev = &this->inFrame;
    (f->objectList).link.next = &this->inFrame;
    Frame::updateObjects(f);
    return;
  }
  return;
}

Assistant:

void setFrame(Frame *f){
		if(this->object.parent)
			this->inFrame.remove();
		this->object.parent = f;
		if(f){
			f->objectList.add(&this->inFrame);
			f->updateObjects();
		}
	}